

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O0

void __thiscall Array3dTest_ValueType_Test::TestBody(Array3dTest_ValueType_Test *this)

{
  bool bVar1;
  String *this_00;
  Message *in_RDI;
  AssertHelper *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  AssertionResult *in_stack_00000018;
  AssertionResult gtest_ar_;
  undefined1 in_stack_ffffffffffffff9f;
  AssertionResult *in_stack_ffffffffffffffa0;
  type_info *in_stack_ffffffffffffffa8;
  AssertionResult *this_01;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_18;
  
  std::type_info::operator==
            ((type_info *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  this_01 = &local_18;
  testing::AssertionResult::AssertionResult
            (in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    testing::internal::GetBoolAssertionFailureMessage
              (in_stack_00000018,in_stack_00000010,in_stack_00000008,(char *)unaff_retaddr);
    this_00 = (String *)testing::internal::String::c_str((String *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,(char *)CONCAT44(in_stack_ffffffffffffffb4,uVar2));
    testing::internal::AssertHelper::operator=(unaff_retaddr,in_RDI);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::internal::String::~String(this_00);
    testing::Message::~Message((Message *)0x22b010);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x22b07a);
  return;
}

Assistant:

TEST(Array3dTest, ValueType)
{
    ASSERT_TRUE(typeid(Array3d<double>::ValueType) == typeid(double));
}